

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

ULONG PAL_wcstoul(char16_t *nptr,char16_t **endptr,int base)

{
  int iVar1;
  DWORD DVar2;
  int *piVar3;
  char16_t local_42;
  char16_t wc;
  DWORD dwLastError;
  int size;
  unsigned_long res;
  char *s_endptr;
  char *s_nptr;
  char16_t **ppcStack_18;
  int base_local;
  char16_t **endptr_local;
  char16_t *nptr_local;
  
  s_endptr = (char *)0x0;
  res = 0;
  s_nptr._4_4_ = base;
  ppcStack_18 = endptr;
  endptr_local = (char16_t **)nptr;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  iVar1 = WideCharToMultiByte(0,0,nptr,-1,(LPSTR)0x0,0,(LPCSTR)0x0,(LPBOOL)0x0);
  if (iVar1 == 0) {
    DVar2 = GetLastError();
    fprintf(_stderr,"] %s %s:%d","PAL_wcstoul",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/wchar.cpp"
            ,0x2e9);
    fprintf(_stderr,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar2);
    SetLastError(0x57);
    dwLastError = 0;
  }
  else {
    s_endptr = (char *)PAL_malloc((long)iVar1);
    if (s_endptr == (LPSTR)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(8);
      dwLastError = 0;
    }
    else {
      iVar1 = WideCharToMultiByte(0,0,(LPCWSTR)endptr_local,-1,s_endptr,iVar1,(LPCSTR)0x0,
                                  (LPBOOL)0x0);
      if (iVar1 == 0) {
        DVar2 = GetLastError();
        fprintf(_stderr,"] %s %s:%d","PAL_wcstoul",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/wchar.cpp"
                ,0x2fa);
        fprintf(_stderr,"WideCharToMultiByte failed.  Error is %d\n",(ulong)DVar2);
        SetLastError(0x57);
        dwLastError = 0;
      }
      else {
        _dwLastError = strtoul(s_endptr,(char **)&res,s_nptr._4_4_);
        if (0xffffffff < _dwLastError) {
          local_42 = *(char16_t *)endptr_local;
          while (iVar1 = PAL_iswspace(local_42), iVar1 != 0) {
            local_42 = *(char16_t *)endptr_local;
            endptr_local = (char16_t **)((long)endptr_local + 2);
          }
          if (local_42 != L'-') {
            _dwLastError = 0xffffffff;
            piVar3 = __errno_location();
            *piVar3 = 0x22;
          }
        }
        if (ppcStack_18 != (char16_t **)0x0) {
          *ppcStack_18 = (char16_t *)((long)endptr_local + (long)((int)res - (int)s_endptr) * 2);
        }
      }
    }
  }
  PAL_free(s_endptr);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return dwLastError;
  }
  abort();
}

Assistant:

ULONG
__cdecl
PAL_wcstoul(
        const char16_t *nptr,
        char16_t **endptr,
        int base)
{
    char *s_nptr = 0;
    char *s_endptr = 0;
    unsigned long res;
    int size;
    DWORD dwLastError = 0;

    PERF_ENTRY(wcstoul);
    ENTRY("wcstoul (nptr=%p (%S), endptr=%p, base=%d)\n", nptr?nptr:W16_NULLSTRING, nptr?nptr:W16_NULLSTRING,
          endptr, base);

    size = WideCharToMultiByte(CP_ACP, 0, nptr, -1, NULL, 0, NULL, NULL);
    if (!size)
    {
        dwLastError = GetLastError();
        ASSERT("WideCharToMultiByte failed.  Error is %d\n", dwLastError);
        SetLastError(ERROR_INVALID_PARAMETER);
        res = 0;
        goto PAL_wcstoulExit;
    }
    s_nptr = (char *)PAL_malloc(size);
    if (!s_nptr)
    {
        ERROR("PAL_malloc failed\n");
        SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        res = 0;
        goto PAL_wcstoulExit;
    }
    size = WideCharToMultiByte(CP_ACP, 0, nptr, -1, s_nptr, size, NULL, NULL);
    if (!size)
    {
        dwLastError = GetLastError();
        ASSERT("WideCharToMultiByte failed.  Error is %d\n", dwLastError);
        SetLastError(ERROR_INVALID_PARAMETER);
        res = 0;
        goto PAL_wcstoulExit;
    }

    res = strtoul(s_nptr, &s_endptr, base);

#ifdef BIT64
    if (res > _UI32_MAX)
    {
        char16_t wc = *nptr;
        while (PAL_iswspace(wc))
        {
            wc = *nptr++;
        }
        /* If the string represents a positive number that is greater than
           _UI32_MAX, set errno to ERANGE. Otherwise, don't set errno
           to match Windows behavior. */
        if (wc != '-')
        {
            res = _UI32_MAX;
            errno = ERANGE;
        }
    }
#endif

    /* only ASCII characters will be accepted by strtol, and those always get
       mapped to single-byte characters, so the first rejected character will
       have the same index in the multibyte and widechar strings */
    if( endptr )
    {
        size = s_endptr - s_nptr;
        *endptr = (char16_t *)&nptr[size];
    }

PAL_wcstoulExit:
    PAL_free(s_nptr);
    LOGEXIT("wcstoul returning unsigned long %lu\n", res);
    PERF_EXIT(wcstoul);

    /* When returning unsigned long res from this function, it will be
    implicitly cast to ULONG. This handles situations where a string that
    represents a negative number is passed in to wcstoul. The Windows
    behavior is analogous to taking the binary equivalent of the negative
    value and treating it as a positive number. Returning a ULONG from
    this function, as opposed to native unsigned long, allows us to match
    this behavior. The explicit case to ULONG below is used to silence any
    potential warnings due to the implicit casting.  */
    return (ULONG)res;
}